

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binomial_heap.cpp
# Opt level: O0

BinomialNode * binomial_heap_top(BiHeap h)

{
  BinomialNode *pBVar1;
  int local_24;
  _BinomialNode *p_Stack_20;
  int min;
  BinomialNode *x;
  BinomialNode *y;
  BiHeap h_local;
  
  x = (BinomialNode *)0x0;
  pBVar1 = h->head;
  if (pBVar1 != (BinomialNode *)0x0) {
    local_24 = pBVar1->key;
    x = pBVar1;
    for (p_Stack_20 = pBVar1->sibling; p_Stack_20 != (_BinomialNode *)0x0;
        p_Stack_20 = p_Stack_20->sibling) {
      if (p_Stack_20->key < local_24) {
        local_24 = p_Stack_20->key;
        x = p_Stack_20;
      }
    }
  }
  return x;
}

Assistant:

BinomialNode *binomial_heap_top(BiHeap h) {
    BinomialNode *y = NULL;
    BinomialNode *x = h->head;
    if (x != NULL) {
        int min = x->key;
        y = x;
        x = x->sibling;
        // travelling the list of the root nodes to find the minimum node
        while (x != NULL) {
            if (x->key < min) {
                min = x->key;
                y = x;
            }
            x = x->sibling;
        }
    }
    return y;
}